

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O1

void heap_init(long n)

{
  long *plVar1;
  
  allocate_heap(n);
  _heap_size = 0;
  if (0 < n) {
    plVar1 = &_heap->idx;
    do {
      *plVar1 = 0;
      plVar1 = plVar1 + 3;
      n = n + -1;
    } while (n != 0);
  }
  return;
}

Assistant:

void  heap_init( long  n )
{
  register long  p;

  allocate_heap( n );
  _heap_size = 0;
  for( p = 0;  p < n;  p++ )
  { 
    heap_idx( p ) = 0;
  }
 
}